

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkparser.cpp
# Opt level: O0

void parsePipeData(Pipe *pipe,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *tokenList)

{
  pointer *ppbVar1;
  char *pcVar2;
  bool bVar3;
  size_type sVar4;
  InputError *pIVar5;
  string local_188 [39];
  allocator local_161;
  string local_160 [39];
  allocator local_139;
  string local_138 [39];
  allocator local_111;
  string local_110 [32];
  string local_f0 [8];
  string s;
  string local_c8 [39];
  undefined1 local_a1;
  string local_a0 [36];
  int local_7c;
  pointer pbStack_78;
  int i;
  double x [3];
  string *tokens;
  allocator local_41;
  string local_40 [36];
  int local_1c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_18;
  int nTokens;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tokenList_local;
  Pipe *pipe_local;
  
  pvStack_18 = tokenList;
  tokenList_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)pipe;
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(tokenList);
  local_1c = (int)sVar4;
  if (local_1c < 6) {
    pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"",&local_41);
    InputError::InputError(pIVar5,2,(string *)local_40);
    __cxa_throw(pIVar5,&InputError::typeinfo,InputError::~InputError);
  }
  x[2] = (double)std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](pvStack_18,0);
  for (local_7c = 0; local_7c < 3; local_7c = local_7c + 1) {
    bVar3 = Utilities::parseNumber<double>
                      ((string *)((long)x[2] + (long)(local_7c + 3) * 0x20),
                       (double *)((long)&stack0xffffffffffffff88 + (long)local_7c * 8));
    if ((!bVar3) || (*(double *)((long)&stack0xffffffffffffff88 + (long)local_7c * 8) <= 0.0)) {
      local_a1 = 1;
      pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string(local_a0,(string *)((long)local_7c * 0x20 + 0x60 + (long)x[2]));
      InputError::InputError(pIVar5,6,(string *)local_a0);
      local_a1 = 0;
      __cxa_throw(pIVar5,&InputError::typeinfo,InputError::~InputError);
    }
  }
  tokenList_local[6].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pbStack_78;
  tokenList_local[3].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)x[0];
  tokenList_local[7].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)x[1];
  if ((6 < local_1c) &&
     ((bVar3 = Utilities::parseNumber<double>
                         ((string *)((long)x[2] + 0xc0),
                          (double *)
                          &tokenList_local[3].
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish), !bVar3 ||
      (ppbVar1 = &tokenList_local[3].
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
      (double)*ppbVar1 <= 0.0 && (double)*ppbVar1 != 0.0)))) {
    pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string(local_c8,(string *)((long)x[2] + 0xc0));
    InputError::InputError(pIVar5,6,(string *)local_c8);
    __cxa_throw(pIVar5,&InputError::typeinfo,InputError::~InputError);
  }
  if ((7 < local_1c) &&
     (bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)x[2] + 0xe0),"*"), bVar3)) {
    std::__cxx11::string::string(local_f0,(string *)((long)x[2] + 0xe0));
    pcVar2 = w_OPEN;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,pcVar2,&local_111);
    bVar3 = Utilities::match((string *)local_f0,(string *)local_110);
    std::__cxx11::string::~string(local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    pcVar2 = w_CLOSED;
    if (bVar3) {
      *(undefined4 *)
       &tokenList_local[2].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_138,pcVar2,&local_139);
      bVar3 = Utilities::match((string *)local_f0,(string *)local_138);
      std::__cxx11::string::~string(local_138);
      std::allocator<char>::~allocator((allocator<char> *)&local_139);
      pcVar2 = w_CV;
      if (bVar3) {
        *(undefined4 *)
         &tokenList_local[2].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = 0;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_160,pcVar2,&local_161);
        bVar3 = Utilities::match((string *)local_f0,(string *)local_160);
        std::__cxx11::string::~string(local_160);
        std::allocator<char>::~allocator((allocator<char> *)&local_161);
        if (!bVar3) {
          pIVar5 = (InputError *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string(local_188,local_f0);
          InputError::InputError(pIVar5,3,(string *)local_188);
          __cxa_throw(pIVar5,&InputError::typeinfo,InputError::~InputError);
        }
        *(undefined1 *)
         &tokenList_local[6].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = 1;
      }
    }
    std::__cxx11::string::~string(local_f0);
  }
  return;
}

Assistant:

void parsePipeData(Pipe* pipe, vector<string>& tokenList)
{
    // Contents of tokenList are:
    // 0 - pipe ID
    // 1 - start node ID
    // 2 - end node ID
    // 3 - length
    // 4 - diameter
    // 5 - roughness
    // 6 - minor loss coeff. (optional)
    // 7 - initial status (optional)

    int nTokens = tokenList.size();
    if ( nTokens < 6 ) throw InputError(InputError::TOO_FEW_ITEMS, "");
    string* tokens = &tokenList[0];

    // ... read length, diameter, and roughness

    double x[3];
    for (int i = 0; i < 3; i++)
    {
        if ( !Utilities::parseNumber(tokens[3+i], x[i]) || x[i] <= 0.0 )
        {
            throw InputError(InputError::INVALID_NUMBER, tokens[3+i]);
        }
    }
    pipe->length    = x[0];
    pipe->diameter  = x[1];
    pipe->roughness = x[2];

    // ... read optional minor loss coeff.

    if ( nTokens > 6 )
    {
        if ( !Utilities::parseNumber(tokens[6], pipe->lossCoeff) ||
             pipe->lossCoeff < 0.0)
        {
            throw InputError(InputError::INVALID_NUMBER, tokens[6]);
        }
    }

    // ... read optional initial status

    if ( nTokens > 7 && tokens[7] != "*" )
    {
        string s = tokens[7];
        if      (Utilities::match(s, w_OPEN))   pipe->initStatus = Link::LINK_OPEN;
        else if (Utilities::match(s, w_CLOSED)) pipe->initStatus = Link::LINK_CLOSED;
        else if (Utilities::match(s, w_CV))     pipe->hasCheckValve = true;
        else throw InputError(InputError::INVALID_KEYWORD, s);
    }
}